

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

Throw * __thiscall MixedArena::alloc<wasm::Throw>(MixedArena *this)

{
  Throw *pTVar1;
  
  pTVar1 = (Throw *)allocSpace(this,0x40,8);
  (pTVar1->super_SpecificExpression<(wasm::Expression::Id)54>).super_Expression._id = ThrowId;
  (pTVar1->super_SpecificExpression<(wasm::Expression::Id)54>).super_Expression.type.id = 0;
  (pTVar1->tag).super_IString.str._M_len = 0;
  (pTVar1->tag).super_IString.str._M_str = (char *)0x0;
  (pTVar1->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
       = (Expression **)0x0;
  (pTVar1->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  usedElements = 0;
  (pTVar1->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  allocatedElements = 0;
  (pTVar1->operands).allocator = this;
  return pTVar1;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }